

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompressedArray.cpp
# Opt level: O0

void __thiscall
CompressedArray::CompressedArray
          (CompressedArray *this,vector<Record,_std::allocator<Record>_> *sorted_records)

{
  size_type sVar1;
  size_type sVar2;
  vector<Record,_std::allocator<Record>_> *in_RSI;
  Serializable *in_RDI;
  vector<Record,_std::allocator<Record>_> *in_stack_00000008;
  CompressedArray *in_stack_00000010;
  size_t new_size;
  size_t old_size;
  BlockHeader header;
  vector<Record,_std::allocator<Record>_> *in_stack_000000a8;
  uint32_t record_index;
  CompressedArray *in_stack_000000b0;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  value_type *__x;
  vector<bool,_std::allocator<bool>_> *this_00;
  vector<bool,_std::allocator<bool>_> *in_stack_ffffffffffffff60;
  vector<CompressedArray::BlockHeader,_std::allocator<CompressedArray::BlockHeader>_>
  *in_stack_ffffffffffffff68;
  vector<CompressedArray::BlockHeader,_std::allocator<CompressedArray::BlockHeader>_>
  *in_stack_ffffffffffffff70;
  uint local_3c;
  vector<bool,_std::allocator<bool>_> *in_stack_ffffffffffffffd8;
  vector<bool,_std::allocator<bool>_> *in_stack_ffffffffffffffe0;
  
  Serializable::Serializable(in_RDI);
  in_RDI->_vptr_Serializable = (_func_int **)&PTR_dump_00192ce8;
  std::vector<bool,_std::allocator<bool>_>::vector((vector<bool,_std::allocator<bool>_> *)0x16017b);
  std::vector<CompressedArray::BlockHeader,_std::allocator<CompressedArray::BlockHeader>_>::vector
            ((vector<CompressedArray::BlockHeader,_std::allocator<CompressedArray::BlockHeader>_> *)
             0x16018e);
  Vocabulary<unsigned_int>::Vocabulary
            ((Vocabulary<unsigned_int> *)
             CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
  this_00 = (vector<bool,_std::allocator<bool>_> *)(in_RDI + 0x10);
  Vocabulary<unsigned_int>::Vocabulary
            ((Vocabulary<unsigned_int> *)
             CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
  __x = (value_type *)(in_RDI + 0x14);
  Vocabulary<unsigned_int>::Vocabulary
            ((Vocabulary<unsigned_int> *)
             CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
  std::vector<Record,_std::allocator<Record>_>::vector
            ((vector<Record,_std::allocator<Record>_> *)in_stack_ffffffffffffff70,
             (vector<Record,_std::allocator<Record>_> *)in_stack_ffffffffffffff68);
  store_values(in_stack_00000010,in_stack_00000008);
  std::vector<Record,_std::allocator<Record>_>::~vector
            ((vector<Record,_std::allocator<Record>_> *)this_00);
  sVar1 = std::vector<Record,_std::allocator<Record>_>::size(in_RSI);
  *(int *)&in_RDI[0x18]._vptr_Serializable = (int)sVar1;
  find_best_radix_parameters(in_stack_000000b0,in_stack_000000a8);
  local_3c = 0;
  do {
    if (*(uint *)&in_RDI[0x18]._vptr_Serializable <= local_3c) {
      std::vector<CompressedArray::BlockHeader,_std::allocator<CompressedArray::BlockHeader>_>::
      vector(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      std::vector<CompressedArray::BlockHeader,_std::allocator<CompressedArray::BlockHeader>_>::swap
                ((vector<CompressedArray::BlockHeader,_std::allocator<CompressedArray::BlockHeader>_>
                  *)this_00,
                 (vector<CompressedArray::BlockHeader,_std::allocator<CompressedArray::BlockHeader>_>
                  *)__x);
      std::vector<CompressedArray::BlockHeader,_std::allocator<CompressedArray::BlockHeader>_>::
      ~vector((vector<CompressedArray::BlockHeader,_std::allocator<CompressedArray::BlockHeader>_> *
              )this_00);
      std::vector<bool,_std::allocator<bool>_>::vector
                (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
      std::vector<bool,_std::allocator<bool>_>::swap
                (this_00,(vector<bool,_std::allocator<bool>_> *)__x);
      std::vector<bool,_std::allocator<bool>_>::~vector
                ((vector<bool,_std::allocator<bool>_> *)0x160433);
      return;
    }
    BlockHeader::BlockHeader((BlockHeader *)0x160256);
    std::vector<Record,_std::allocator<Record>_>::operator[](in_RSI,(ulong)local_3c);
    std::vector<bool,_std::allocator<bool>_>::size(in_stack_ffffffffffffff60);
    std::vector<CompressedArray::BlockHeader,_std::allocator<CompressedArray::BlockHeader>_>::
    push_back((vector<CompressedArray::BlockHeader,_std::allocator<CompressedArray::BlockHeader>_> *
              )this_00,__x);
    sVar1 = std::vector<bool,_std::allocator<bool>_>::size(in_stack_ffffffffffffff60);
    local_3c = fill_block((CompressedArray *)header._8_8_,
                          (vector<Record,_std::allocator<Record>_> *)header.key,old_size._4_4_);
    sVar2 = std::vector<bool,_std::allocator<bool>_>::size(in_stack_ffffffffffffff60);
  } while (sVar2 - sVar1 < 0x401);
  __assert_fail("new_size - old_size <= max_block_size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/pavellevap[P]ngram_storage/src/CompressedArray.cpp"
                ,0x1b,"CompressedArray::CompressedArray(vector<Record>)");
}

Assistant:

CompressedArray::CompressedArray(vector<Record> sorted_records) {
    store_values(sorted_records);
    record_count = uint32_t(sorted_records.size());
    find_best_radix_parameters(sorted_records);

    uint32_t record_index = 0;
    while (record_index < record_count) {
        BlockHeader header;
        header.key = sorted_records[record_index].key;
        header.record_index = record_index;
        header.offset = uint32_t(data.size());
        headers.push_back(header);

        size_t old_size = data.size();
        record_index = fill_block(sorted_records, record_index);
        size_t new_size = data.size();
        assert(new_size - old_size <= max_block_size);
    }
    vector<BlockHeader>(headers).swap(headers);
    vector<bool>(data).swap(data);
}